

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.cpp
# Opt level: O0

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::MessageConditionalOperator::process
          (MessageConditionalOperator *this,
          unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *message)

{
  bool bVar1;
  function<bool_(const_helics::Message_*)> *this_00;
  long in_RSI;
  __uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true> in_RDI;
  Message *in_stack_ffffffffffffffb8;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *in_stack_ffffffffffffffc0;
  
  bVar1 = std::function::operator_cast_to_bool((function<bool_(const_helics::Message_*)> *)0x3a4c28)
  ;
  if (bVar1) {
    this_00 = (function<bool_(const_helics::Message_*)> *)(in_RSI + 8);
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::get
              ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)this_00);
    bVar1 = std::function<bool_(const_helics::Message_*)>::operator()
                      (this_00,in_stack_ffffffffffffffb8);
    if (bVar1) {
      std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::unique_ptr
                ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)this_00,
                 (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                 in_stack_ffffffffffffffb8);
    }
    else {
      std::unique_ptr<helics::Message,std::default_delete<helics::Message>>::
      unique_ptr<std::default_delete<helics::Message>,void>
                ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)this_00,
                 in_stack_ffffffffffffffb8);
    }
  }
  else {
    std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::unique_ptr
              (in_stack_ffffffffffffffc0,
               (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
               in_stack_ffffffffffffffb8);
  }
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (tuple<helics::Message_*,_std::default_delete<helics::Message>_>)
         in_RDI.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
         super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
         super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Message> MessageConditionalOperator::process(std::unique_ptr<Message> message)
{
    if (evalFunction) {
        if (evalFunction(message.get())) {
            return message;
        }
        return nullptr;
    }
    return message;
}